

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void __thiscall llvm::APInt::Profile(APInt *this,FoldingSetNodeID *ID)

{
  bool bVar1;
  uint uVar2;
  uint local_20;
  uint i;
  uint NumWords;
  FoldingSetNodeID *ID_local;
  APInt *this_local;
  
  FoldingSetNodeID::AddInteger(ID,this->BitWidth);
  bVar1 = isSingleWord(this);
  if (bVar1) {
    FoldingSetNodeID::AddInteger(ID,(this->U).VAL);
  }
  else {
    uVar2 = getNumWords(this);
    for (local_20 = 0; local_20 < uVar2; local_20 = local_20 + 1) {
      FoldingSetNodeID::AddInteger(ID,(this->U).pVal[local_20]);
    }
  }
  return;
}

Assistant:

void APInt::Profile(FoldingSetNodeID& ID) const {
  ID.AddInteger(BitWidth);

  if (isSingleWord()) {
    ID.AddInteger(U.VAL);
    return;
  }

  unsigned NumWords = getNumWords();
  for (unsigned i = 0; i < NumWords; ++i)
    ID.AddInteger(U.pVal[i]);
}